

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

VarSet * __thiscall libDAI::FactorGraph::Delta(FactorGraph *this,VarSet *ns)

{
  bool bVar1;
  const_iterator __lhs;
  reference pVVar2;
  long *in_RSI;
  VarSet *in_RDI;
  const_iterator n;
  VarSet *result;
  VarSet *in_stack_ffffffffffffff68;
  VarSet *in_stack_ffffffffffffff70;
  int iVar3;
  VarSet *this_00;
  undefined1 local_60 [8];
  VarSet *in_stack_ffffffffffffffa8;
  VarSet *in_stack_ffffffffffffffb0;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  VarSet::VarSet(in_stack_ffffffffffffff70);
  local_28._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff68);
  while( true ) {
    __lhs = VarSet::end(in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff68);
    iVar3 = (int)((ulong)__lhs._M_current >> 0x20);
    if (!bVar1) break;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_28);
    (**(code **)(*in_RSI + 0x68))(local_60,in_RSI,pVVar2);
    VarSet::operator|=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    VarSet::~VarSet((VarSet *)0xb3bfa1);
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)this_00,iVar3);
  }
  return in_RDI;
}

Assistant:

VarSet FactorGraph::Delta( const VarSet &ns ) const {
        VarSet result;
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ ) 
            result |= Delta(*n);
        return result;
    }